

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.hpp
# Opt level: O1

bool __thiscall
BSTree<const_int_&,_int>::BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>::insert
          (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode> *this,int *key,int val)

{
  int iVar1;
  bool bVar2;
  pointer __p;
  _Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false> _Var3;
  tuple<BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  tVar4;
  _Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false> _Var5;
  int iVar6;
  default_delete<BSTree<const_int_&,_int>::BSTreeNode> *this_00;
  BSTreeNode *local_28;
  
  _Var3._M_head_impl =
       (this->root)._M_t.
       super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
       ._M_t.
       super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
       .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (BSTreeNode *)0x0) {
    _Var3._M_head_impl = (BSTreeNode *)operator_new(0x20);
    (_Var3._M_head_impl)->key = key;
    (_Var3._M_head_impl)->val = val;
    ((_Var3._M_head_impl)->left)._M_t =
         (__uniq_ptr_data<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>,_true,_true>
          )0x0;
    ((_Var3._M_head_impl)->right)._M_t =
         (__uniq_ptr_data<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>,_true,_true>
          )0x0;
    (this->root)._M_t.
    super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
    ._M_t.
    super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
    .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl =
         _Var3._M_head_impl;
LAB_00101544:
    bVar2 = true;
  }
  else {
    iVar1 = *key;
    iVar6 = *(_Var3._M_head_impl)->key;
    while (iVar1 != iVar6) {
      if (iVar1 < iVar6) {
        _Var5._M_head_impl =
             *(BSTreeNode **)
              &((_Var3._M_head_impl)->left)._M_t.
               super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
               ._M_t.
               super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
        ;
        if ((_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)_Var5._M_head_impl ==
            (_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)0x0) {
          tVar4.
          super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                )operator_new(0x20);
          *(int **)tVar4.
                   super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                   .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>.
                   _M_head_impl = key;
          *(int *)((long)tVar4.
                         super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                         .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>.
                         _M_head_impl + 8) = val;
          *(undefined8 *)
           ((long)tVar4.
                  super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                  .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl
           + 0x10) = 0;
          *(undefined8 *)
           ((long)tVar4.
                  super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                  .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl
           + 0x18) = 0;
          local_28 = (BSTreeNode *)0x0;
          _Var5._M_head_impl =
               *(BSTreeNode **)
                &((_Var3._M_head_impl)->left)._M_t.
                 super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ;
          ((_Var3._M_head_impl)->left)._M_t.
          super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
               = tVar4.
                 super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                 .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl;
          if ((_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)_Var5._M_head_impl !=
              (_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)0x0) {
            this_00 = (default_delete<BSTree<const_int_&,_int>::BSTreeNode> *)
                      &(_Var3._M_head_impl)->left;
LAB_001015b3:
            local_28 = (BSTreeNode *)0x0;
            std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>::operator()
                      (this_00,_Var5._M_head_impl);
          }
LAB_001015bb:
          if (local_28 != (BSTreeNode *)0x0) {
            std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>::operator()
                      ((default_delete<BSTree<const_int_&,_int>::BSTreeNode> *)&local_28,local_28);
          }
          goto LAB_00101544;
        }
      }
      else {
        _Var5._M_head_impl = _Var3._M_head_impl;
        if ((iVar6 < iVar1) &&
           (_Var5._M_head_impl =
                 *(BSTreeNode **)
                  &((_Var3._M_head_impl)->right)._M_t.
                   super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
           , (_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)_Var5._M_head_impl ==
             (_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)0x0)) {
          tVar4.
          super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                )operator_new(0x20);
          *(int **)tVar4.
                   super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                   .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>.
                   _M_head_impl = key;
          *(int *)((long)tVar4.
                         super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                         .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>.
                         _M_head_impl + 8) = val;
          *(undefined8 *)
           ((long)tVar4.
                  super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                  .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl
           + 0x10) = 0;
          *(undefined8 *)
           ((long)tVar4.
                  super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                  .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl
           + 0x18) = 0;
          local_28 = (BSTreeNode *)0x0;
          _Var5._M_head_impl =
               *(BSTreeNode **)
                &((_Var3._M_head_impl)->right)._M_t.
                 super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ;
          ((_Var3._M_head_impl)->right)._M_t.
          super___uniq_ptr_impl<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
               = tVar4.
                 super__Tuple_impl<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                 .super__Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>._M_head_impl;
          if ((_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)_Var5._M_head_impl !=
              (_Head_base<0UL,_BSTree<const_int_&,_int>::BSTreeNode_*,_false>)0x0) {
            this_00 = (default_delete<BSTree<const_int_&,_int>::BSTreeNode> *)
                      &(_Var3._M_head_impl)->right;
            goto LAB_001015b3;
          }
          goto LAB_001015bb;
        }
      }
      _Var3._M_head_impl = _Var5._M_head_impl;
      iVar6 = *(_Var5._M_head_impl)->key;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool insert(Key key, Val val){
      // if tree is not empty ...
      if (root){
        // we perform a traversal until we reach an empty subtree
        Node* currentNode = root.get();
        while (currentNode){
          // if key is present, no insertion is made
          if (key == currentNode->key){
            return false;
          }
          // otherwise we go down
          else{
            if (key < currentNode->key){
              // either we recursively insert into a nonempty subtree
              // ...
              if (currentNode->left){
                currentNode = currentNode->left.get();
              }
              // ... or we perform insertion in an empty subtree
              else{
                currentNode->left = std::make_unique<Node>(key, val);
                return true;
              }
            }
            // the same goes for right descent
            else if (key > currentNode->key){
              if (currentNode->right){
                currentNode = currentNode->right.get();
              }
              else{
                currentNode->right = std::make_unique<Node>(key, val);
                return true;
              }
            }
          }
        }
      }
      // if tree is empty, we insert at root
      else{
        root = std::make_unique<Node>(key, val);
        return true;
      }
      // this line should not be reached
      return true;
    }